

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall
t_c_glib_generator::generate_struct_reader
          (t_c_glib_generator *this,ostream *out,t_struct *tstruct,string *this_name,
          string *this_get,bool is_function)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  e_req eVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  ulong uVar6;
  t_type *type;
  reference pptVar7;
  string *psVar8;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_858
  ;
  t_field **local_850;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  allocator local_621;
  string local_620;
  string local_600;
  string local_5e0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_5c0
  ;
  t_field **local_5b8;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_210
  ;
  t_field **local_208;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_100
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  undefined1 local_e8 [4];
  int error_ret;
  undefined1 local_c8 [8];
  string name_uc;
  string local_98;
  undefined1 local_78 [8];
  string name_u;
  string name;
  bool is_function_local;
  string *this_get_local;
  string *this_name_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_c_glib_generator *this_local;
  
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string
            ((string *)(name_u.field_2._M_local_buf + 8),(string *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::string((string *)&local_98,(string *)(name_u.field_2._M_local_buf + 8));
  initial_caps_to_underscores((string *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)local_e8,(string *)local_78);
  to_upper_case((string *)local_c8,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  fields._4_4_ = 0;
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_100);
  if (is_function) {
    fields._4_4_ = -1;
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"/* reads a ");
    poVar5 = std::operator<<(poVar5,(string *)local_78);
    poVar5 = std::operator<<(poVar5," object */");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"static gint32");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)&this->nspace_lc);
    poVar5 = std::operator<<(poVar5,(string *)local_78);
    poVar5 = std::operator<<(poVar5,
                             "_read (ThriftStruct *object, ThriftProtocol *protocol, GError **error)"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_120);
  poVar5 = std::operator<<(poVar5,"gint32 ret;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_140);
  poVar5 = std::operator<<(poVar5,"gint32 xfer = 0;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_160);
  poVar5 = std::operator<<(poVar5,"gchar *name = NULL;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_180);
  poVar5 = std::operator<<(poVar5,"ThriftType ftype;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_1a0);
  poVar5 = std::operator<<(poVar5,"gint16 fid;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
  poVar5 = std::operator<<(poVar5,"guint32 len = 0;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_1e0);
  poVar5 = std::operator<<(poVar5,"gpointer data = NULL;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_200);
  poVar5 = std::operator<<(poVar5,(string *)this_get);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  local_208 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_100._M_current = local_208;
  while( true ) {
    local_210._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_100,&local_210);
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    eVar4 = t_field::get_req(*pptVar7);
    if (eVar4 == T_REQUIRED) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"gboolean isset_");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_100);
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5," = FALSE;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_100);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_230);
  poVar5 = std::operator<<(poVar5,"/* satisfy -Wall in case these aren\'t used */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_250);
  poVar5 = std::operator<<(poVar5,"THRIFT_UNUSED_VAR (len);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_270);
  poVar5 = std::operator<<(poVar5,"THRIFT_UNUSED_VAR (data);");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_290);
    poVar5 = std::operator<<(poVar5,"THRIFT_UNUSED_VAR (this_object);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2b0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_2b0);
  poVar5 = std::operator<<(poVar5,"/* read the struct begin marker */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_2d0);
  poVar5 = std::operator<<(poVar5,
                           "if ((ret = thrift_protocol_read_struct_begin (protocol, &name, error)) < 0)"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_2f0);
  poVar5 = std::operator<<(poVar5,"{");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_310);
  poVar5 = std::operator<<(poVar5,"  if (name) g_free (name);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_330);
  poVar5 = std::operator<<(poVar5,"  return ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fields._4_4_);
  poVar5 = std::operator<<(poVar5,";");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_350);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_370,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_370);
  poVar5 = std::operator<<(poVar5,"xfer += ret;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_390,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_390);
  poVar5 = std::operator<<(poVar5,"if (name) g_free (name);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3b0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_3b0);
  poVar5 = std::operator<<(poVar5,"name = NULL;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_3d0);
  poVar5 = std::operator<<(poVar5,"/* read the struct fields */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3f0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_3f0);
  poVar5 = std::operator<<(poVar5,"while (1)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_410,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_410);
  poVar5 = std::operator<<(poVar5,"/* read the beginning of a field */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_430,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_430);
  poVar5 = std::operator<<(poVar5,
                           "if ((ret = thrift_protocol_read_field_begin (protocol, &name, &ftype, &fid, error)) < 0)"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_450,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_450);
  poVar5 = std::operator<<(poVar5,"{");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_470,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_470);
  poVar5 = std::operator<<(poVar5,"  if (name) g_free (name);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_490,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_490);
  poVar5 = std::operator<<(poVar5,"  return ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fields._4_4_);
  poVar5 = std::operator<<(poVar5,";");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4b0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_4b0);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4d0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_4d0);
  poVar5 = std::operator<<(poVar5,"xfer += ret;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4f0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_4f0);
  poVar5 = std::operator<<(poVar5,"if (name) g_free (name);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_510,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_510);
  poVar5 = std::operator<<(poVar5,"name = NULL;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  t_generator::indent_abi_cxx11_(&local_530,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_530);
  poVar5 = std::operator<<(poVar5,"/* break if we get a STOP field */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_550,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_550);
  poVar5 = std::operator<<(poVar5,"if (ftype == T_STOP)");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_570,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_570);
  poVar5 = std::operator<<(poVar5,"{");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_590,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_590);
  poVar5 = std::operator<<(poVar5,"  break;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5b0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_5b0);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_530);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"switch (fid)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  local_5b8 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_100._M_current = local_5b8;
  while( true ) {
    local_5c0._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_100,&local_5c0);
    if (!bVar1) break;
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"case ");
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    iVar3 = t_field::get_key(*pptVar7);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5,":");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"if (ftype == ");
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    type = t_field::get_type(*pptVar7);
    type_to_enum_abi_cxx11_(&local_5e0,this,type);
    poVar5 = std::operator<<(poVar5,(string *)&local_5e0);
    poVar5 = std::operator<<(poVar5,")");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_5e0);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"{");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    tfield = *pptVar7;
    std::__cxx11::string::string((string *)&local_600,(string *)this_name);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_620,"",&local_621);
    generate_deserialize_field(this,out,tfield,&local_600,&local_620,fields._4_4_,false);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator((allocator<char> *)&local_621);
    std::__cxx11::string::~string((string *)&local_600);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_648,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_648);
    poVar5 = std::operator<<(poVar5,"} else {");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_668,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_668);
    poVar5 = std::operator<<(poVar5,
                             "  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_688,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_688);
    poVar5 = std::operator<<(poVar5,"    return ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fields._4_4_);
    poVar5 = std::operator<<(poVar5,";");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_6a8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_6a8);
    poVar5 = std::operator<<(poVar5,"  xfer += ret;");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_6c8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_6c8);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_6e8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_6e8);
    poVar5 = std::operator<<(poVar5,"break;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_648);
    t_generator::indent_down((t_generator *)this);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_100);
  }
  t_generator::indent_abi_cxx11_(&local_708,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_708);
  poVar5 = std::operator<<(poVar5,"default:");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_728,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_728);
  poVar5 = std::operator<<(poVar5,"  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_748,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_748);
  poVar5 = std::operator<<(poVar5,"    return ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fields._4_4_);
  poVar5 = std::operator<<(poVar5,";");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_768,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_768);
  poVar5 = std::operator<<(poVar5,"  xfer += ret;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_788,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_788);
  poVar5 = std::operator<<(poVar5,"  break;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_7a8,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_7a8);
  poVar5 = std::operator<<(poVar5,
                           "if ((ret = thrift_protocol_read_field_end (protocol, error)) < 0)");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_7c8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_7c8);
  poVar5 = std::operator<<(poVar5,"  return ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fields._4_4_);
  poVar5 = std::operator<<(poVar5,";");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_7e8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_7e8);
  poVar5 = std::operator<<(poVar5,"xfer += ret;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7a8);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_808,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_808);
  poVar5 = std::operator<<(poVar5,
                           "if ((ret = thrift_protocol_read_struct_end (protocol, error)) < 0)");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_828,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_828);
  poVar5 = std::operator<<(poVar5,"  return ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fields._4_4_);
  poVar5 = std::operator<<(poVar5,";");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_848,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_848);
  poVar5 = std::operator<<(poVar5,"xfer += ret;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_808);
  local_850 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_100._M_current = local_850;
  while( true ) {
    local_858._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_100,&local_858);
    if (!bVar1) break;
    pptVar7 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_100);
    eVar4 = t_field::get_req(*pptVar7);
    if (eVar4 == T_REQUIRED) {
      t_generator::indent_abi_cxx11_(&local_878,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_878);
      poVar5 = std::operator<<(poVar5,"if (!isset_");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_100);
      psVar8 = t_field::get_name_abi_cxx11_(*pptVar7);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,")");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_898,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_898);
      poVar5 = std::operator<<(poVar5,"{");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_8b8,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_8b8);
      poVar5 = std::operator<<(poVar5,"  g_set_error (error, THRIFT_PROTOCOL_ERROR,");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_8d8,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_8d8);
      poVar5 = std::operator<<(poVar5,"               THRIFT_PROTOCOL_ERROR_INVALID_DATA,");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_8f8,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_8f8);
      poVar5 = std::operator<<(poVar5,"               \"missing field\");");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_918,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_918);
      poVar5 = std::operator<<(poVar5,"  return -1;");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_938,(t_generator *)this);
      poVar5 = std::operator<<(poVar5,(string *)&local_938);
      poVar5 = std::operator<<(poVar5,"}");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_878);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_100);
  }
  if (is_function) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"return xfer;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_down((t_generator *)this);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(name_u.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_c_glib_generator::generate_struct_reader(ostream& out,
                                                t_struct* tstruct,
                                                string this_name,
                                                string this_get,
                                                bool is_function) {
  string name = tstruct->get_name();
  string name_u = initial_caps_to_underscores(name);
  string name_uc = to_upper_case(name_u);
  int error_ret = 0;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (is_function) {
    error_ret = -1;
    indent(out) << "/* reads a " << name_u << " object */" << endl << "static gint32" << endl
                << this->nspace_lc << name_u
                << "_read (ThriftStruct *object, ThriftProtocol *protocol, GError **error)" << endl;
  }

  indent(out) << "{" << endl;
  indent_up();

  // declare stack temp variables
  out << indent() << "gint32 ret;" << endl << indent() << "gint32 xfer = 0;" << endl << indent()
      << "gchar *name = NULL;" << endl << indent() << "ThriftType ftype;" << endl << indent()
      << "gint16 fid;" << endl << indent() << "guint32 len = 0;" << endl << indent()
      << "gpointer data = NULL;" << endl << indent() << this_get << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      indent(out) << "gboolean isset_" << (*f_iter)->get_name() << " = FALSE;" << endl;
    }
  }

  out << endl;

  // satisfy -Wall in case we don't use some variables
  out << indent() << "/* satisfy -Wall in case these aren't used */" << endl << indent()
      << "THRIFT_UNUSED_VAR (len);" << endl << indent() << "THRIFT_UNUSED_VAR (data);" << endl;

  if (!this_get.empty()) {
    out << indent() << "THRIFT_UNUSED_VAR (this_object);" << endl;
  }
  out << endl;

  // read the beginning of the structure marker
  out << indent() << "/* read the struct begin marker */" << endl << indent()
      << "if ((ret = thrift_protocol_read_struct_begin (protocol, &name, error)) < 0)" << endl
      << indent() << "{" << endl << indent() << "  if (name) g_free (name);" << endl << indent()
      << "  return " << error_ret << ";" << endl << indent() << "}" << endl << indent()
      << "xfer += ret;" << endl << indent() << "if (name) g_free (name);" << endl << indent()
      << "name = NULL;" << endl << endl;

  // read the struct fields
  out << indent() << "/* read the struct fields */" << endl << indent() << "while (1)" << endl;
  scope_up(out);

  // read beginning field marker
  out << indent() << "/* read the beginning of a field */" << endl << indent()
      << "if ((ret = thrift_protocol_read_field_begin (protocol, &name, &ftype, &fid, error)) < 0)"
      << endl << indent() << "{" << endl << indent() << "  if (name) g_free (name);" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "}" << endl << indent()
      << "xfer += ret;" << endl << indent() << "if (name) g_free (name);" << endl << indent()
      << "name = NULL;" << endl << endl;

  // check for field STOP marker
  out << indent() << "/* break if we get a STOP field */" << endl << indent()
      << "if (ftype == T_STOP)" << endl << indent() << "{" << endl << indent() << "  break;" << endl
      << indent() << "}" << endl << endl;

  // switch depending on the field type
  indent(out) << "switch (fid)" << endl;

  // start switch
  scope_up(out);

  // generate deserialization code for known types
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if (ftype == " << type_to_enum((*f_iter)->get_type()) << ")" << endl;
    indent(out) << "{" << endl;

    indent_up();
    // generate deserialize field
    generate_deserialize_field(out, *f_iter, this_name, "", error_ret, false);
    indent_down();

    out << indent() << "} else {" << endl << indent()
        << "  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)" << endl << indent()
        << "    return " << error_ret << ";" << endl << indent() << "  xfer += ret;" << endl
        << indent() << "}" << endl << indent() << "break;" << endl;
    indent_down();
  }

  // create the default case
  out << indent() << "default:" << endl << indent()
      << "  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)" << endl << indent()
      << "    return " << error_ret << ";" << endl << indent() << "  xfer += ret;" << endl
      << indent() << "  break;" << endl;

  // end switch
  scope_down(out);

  // read field end marker
  out << indent() << "if ((ret = thrift_protocol_read_field_end (protocol, error)) < 0)" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "xfer += ret;" << endl;

  // end while loop
  scope_down(out);
  out << endl;

  // read the end of the structure
  out << indent() << "if ((ret = thrift_protocol_read_struct_end (protocol, error)) < 0)" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "xfer += ret;" << endl
      << endl;

  // if a required field is missing, throw an error
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      out << indent() << "if (!isset_" << (*f_iter)->get_name() << ")" << endl << indent() << "{"
          << endl << indent() << "  g_set_error (error, THRIFT_PROTOCOL_ERROR," << endl << indent()
          << "               THRIFT_PROTOCOL_ERROR_INVALID_DATA," << endl << indent()
          << "               \"missing field\");" << endl << indent() << "  return -1;" << endl
          << indent() << "}" << endl << endl;
    }
  }

  if (is_function) {
    indent(out) << "return xfer;" << endl;
  }

  // end the function/structure
  indent_down();
  indent(out) << "}" << endl << endl;
}